

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R4_knapsack.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int wt [4];
  int val [4];
  int local_28 [10];
  
  local_28[4] = 6;
  local_28[5] = 10;
  local_28[6] = 0xc;
  local_28[7] = 0;
  local_28[0] = 1;
  local_28[1] = 2;
  local_28[2] = 3;
  local_28[3] = 0;
  uVar1 = knap_sack(3,5,local_28,local_28 + 4);
  printf("Final result: %d\n",(ulong)uVar1);
  return 0;
}

Assistant:

int main() {
  int val[] = {6, 10, 12, 0};
  int wt[] = {1, 2, 3, 0};
  int wu = 5;

  int n = sizeof(val) / sizeof(val[0]) - 1;
  printf("Final result: %d\n", knap_sack(n, wu, wt, val));

  return 0;
}